

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O1

void deqp::gles3::Functional::evalTextureCubeLod(ShaderEvalContext *c,TexLookupParams *p)

{
  int i;
  long lVar1;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  float local_48 [4];
  undefined8 local_38;
  undefined8 uStack_30;
  
  tcu::TextureCubeView::sample
            ((TextureCubeView *)&stack0xffffffffffffffe0,
             (Sampler *)&(c->textures[0].texCube)->m_view,c->in[0].m_data[0],c->in[0].m_data[1],
             c->in[0].m_data[2],c->in[1].m_data[0]);
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  lVar1 = 0;
  do {
    local_48[lVar1] = *(float *)(&stack0xffffffffffffffe0 + lVar1 * 4) * (p->scale).m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_38 = 0;
  uStack_30 = 0;
  lVar1 = 0;
  do {
    *(float *)((long)&local_38 + lVar1 * 4) = local_48[lVar1] + (p->bias).m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  *(undefined8 *)(c->color).m_data = local_38;
  *(undefined8 *)((c->color).m_data + 2) = uStack_30;
  return;
}

Assistant:

static void		evalTextureCubeLod		(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = textureCube(c, c.in[0].x(), c.in[0].y(), c.in[0].z(), c.in[1].x())*p.scale + p.bias; }